

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_sparse.hpp
# Opt level: O2

string * __thiscall
Disa::Matrix_Sparse::range_column_abi_cxx11_(string *__return_storage_ptr__,Matrix_Sparse *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30;
  
  std::__cxx11::to_string(&local_30,this->column_size);
  std::operator+(&local_50,"[0, ",&local_30);
  std::operator+(__return_storage_ptr__,&local_50,")");
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] std::string range_column() const { return "[0, " + std::to_string(column_size) + ")"; }